

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void rd_5dim(char **content,size_t *line_no,int *array,int *dim,int *shift)

{
  int local_48 [2];
  int post [5];
  int *shift_local;
  int *dim_local;
  int *array_local;
  size_t *line_no_local;
  char **content_local;
  
  unique0x1000004a = shift;
  memset(local_48,0,0x14);
  rd_5dim_slice(content,line_no,array,dim,stack0xffffffffffffffd0,local_48);
  return;
}

Assistant:

PRIVATE void
rd_5dim(char    **content,
        size_t  *line_no,
        int     *array,
        int     dim[5],
        int     shift[5])
{
  int post[5] = {
    0, 0, 0, 0, 0
  };

  rd_5dim_slice(content, line_no, array,
                dim,
                shift,
                post);
}